

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmappedfilebuffer.cpp
# Opt level: O2

void __thiscall QMappedFileBuffer::remap(QMappedFileBuffer *this)

{
  QFile *pQVar1;
  undefined8 uVar2;
  uchar *puVar3;
  
  pQVar1 = qobject_cast<QFile*>((QObject *)(this->super_QDeviceBuffer).m_device);
  if (pQVar1 != (QFile *)0x0) {
    if (this->m_mappeddata != (uchar *)0x0) {
      QFileDevice::unmap((uchar *)pQVar1);
    }
    uVar2 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1);
    puVar3 = (uchar *)QFileDevice::map(pQVar1,0,uVar2,0);
    this->m_mappeddata = puVar3;
  }
  return;
}

Assistant:

void QMappedFileBuffer::remap() {
    QFile* f = qobject_cast<QFile*>(m_device);
    if(!f)
        return;

    if(m_mappeddata)
        f->unmap(m_mappeddata);
    m_mappeddata = f->map(0, f->size());
}